

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O1

GraphParts * __thiscall
QGraphicsAnchorLayoutPrivate::getGraphParts
          (GraphParts *__return_storage_ptr__,QGraphicsAnchorLayoutPrivate *this,
          Orientation orientation)

{
  Data *first;
  AnchorVertex *second;
  QSimplexConstraint **b;
  bool bVar1;
  AnchorData *pAVar2;
  AnchorData *pAVar3;
  QList<QSimplexConstraint_*> *this_00;
  iterator iVar4;
  iterator iVar5;
  long lVar6;
  iterator abegin;
  Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData> *this_01;
  long in_FS_OFFSET;
  QList<QSimplexConstraint_*> n;
  QHash<QSimplexVariable_*,_QHashDummyValue> local_70;
  QArrayDataPointer<QSimplexConstraint_*> local_68;
  GraphParts *local_48;
  QHash<QSimplexVariable_*,_QHashDummyValue> *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->nonTrunkConstraints).d.ptr = (QSimplexConstraint **)0x0;
  (__return_storage_ptr__->nonTrunkConstraints).d.size = 0;
  (__return_storage_ptr__->trunkConstraints).d.size = 0;
  (__return_storage_ptr__->nonTrunkConstraints).d.d = (Data *)0x0;
  (__return_storage_ptr__->trunkConstraints).d.d = (Data *)0x0;
  (__return_storage_ptr__->trunkConstraints).d.ptr = (QSimplexConstraint **)0x0;
  lVar6 = (long)(int)orientation;
  this_01 = (this->graph).m_data + lVar6 + -1;
  first = (this->graph).m_data[lVar6 + 1].m_graph.d;
  second = (this->layoutFirstVertex).m_data[lVar6 + 1];
  if (second == (AnchorVertex *)0x0) {
    pAVar2 = Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
             edgeData(this_01,(AnchorVertex *)first,(this->layoutCentralVertex).m_data[lVar6 + 1]);
    pAVar3 = (AnchorData *)0x0;
  }
  else {
    pAVar2 = Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
             edgeData(this_01,(AnchorVertex *)first,second);
    pAVar3 = Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
             edgeData(this_01,(this->layoutFirstVertex).m_data[lVar6 + 1],
                      (this->layoutCentralVertex).m_data[lVar6 + 1]);
  }
  this_00 = &__return_storage_ptr__->nonTrunkConstraints;
  local_68.d = (this->constraints).m_data[lVar6 + -1].d.d;
  local_68.ptr = (this->constraints).m_data[lVar6 + -1].d.ptr;
  local_68.size = (this->constraints).m_data[lVar6 + -1].d.size;
  if (&(local_68.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_68.d)->super_QArrayData).ref_)->ref_)._q_value.super___atomic_base<int>
    ._M_i = (((QArrayData *)&((local_68.d)->super_QArrayData).ref_)->ref_)._q_value.
            super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  b = (this->constraints).m_data[lVar6 + 1].d.ptr;
  QtPrivate::QCommonArrayOps<QSimplexConstraint_*>::growAppend
            ((QCommonArrayOps<QSimplexConstraint_*> *)&local_68,b,
             b + (this->constraints).m_data[lVar6 + 1].d.size);
  QArrayDataPointer<QSimplexConstraint_*>::operator=(&this_00->d,&local_68);
  if (&(local_68.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d)->super_QArrayData,8,0x10);
    }
  }
  local_70.d = (Data *)0x0;
  local_68.d = (Data *)&pAVar2->super_QSimplexVariable;
  if (pAVar2 == (AnchorData *)0x0) {
    local_68.d = (Data *)0x0;
  }
  QHash<QSimplexVariable*,QHashDummyValue>::emplace<QHashDummyValue_const&>
            ((QHash<QSimplexVariable*,QHashDummyValue> *)&local_70,(QSimplexVariable **)&local_68,
             (QHashDummyValue *)&local_48);
  if (pAVar3 != (AnchorData *)0x0) {
    local_68.d = (Data *)&pAVar3->super_QSimplexVariable;
    QHash<QSimplexVariable*,QHashDummyValue>::emplace<QHashDummyValue_const&>
              ((QHash<QSimplexVariable*,QHashDummyValue> *)&local_70,(QSimplexVariable **)&local_68,
               (QHashDummyValue *)&local_48);
  }
  iVar4 = QList<QSimplexConstraint_*>::end(this_00);
  do {
    iVar5 = QList<QSimplexConstraint_*>::begin(this_00);
    local_68.ptr = (QSimplexConstraint **)&local_70;
    lVar6 = (long)iVar4.i - (long)iVar5.i >> 5;
    local_68.d = (Data *)__return_storage_ptr__;
    local_48 = __return_storage_ptr__;
    local_40 = (QHash<QSimplexVariable_*,_QHashDummyValue> *)local_68.ptr;
    if (0 < lVar6) {
      lVar6 = lVar6 + 1;
      do {
        bVar1 = __gnu_cxx::__ops::
                _Iter_pred<QGraphicsAnchorLayoutPrivate::getGraphParts(Qt::Orientation)::$_0>::
                operator()((_Iter_pred<QGraphicsAnchorLayoutPrivate::getGraphParts(Qt::Orientation)::__0>
                            *)&local_68,iVar5);
        abegin.i = iVar5.i;
        if (bVar1) goto LAB_005ce487;
        bVar1 = __gnu_cxx::__ops::
                _Iter_pred<QGraphicsAnchorLayoutPrivate::getGraphParts(Qt::Orientation)::$_0>::
                operator()((_Iter_pred<QGraphicsAnchorLayoutPrivate::getGraphParts(Qt::Orientation)::__0>
                            *)&local_68,(iterator)(iVar5.i + 1));
        abegin.i = iVar5.i + 1;
        if (bVar1) goto LAB_005ce487;
        bVar1 = __gnu_cxx::__ops::
                _Iter_pred<QGraphicsAnchorLayoutPrivate::getGraphParts(Qt::Orientation)::$_0>::
                operator()((_Iter_pred<QGraphicsAnchorLayoutPrivate::getGraphParts(Qt::Orientation)::__0>
                            *)&local_68,(iterator)(iVar5.i + 2));
        abegin.i = iVar5.i + 2;
        if (bVar1) goto LAB_005ce487;
        bVar1 = __gnu_cxx::__ops::
                _Iter_pred<QGraphicsAnchorLayoutPrivate::getGraphParts(Qt::Orientation)::$_0>::
                operator()((_Iter_pred<QGraphicsAnchorLayoutPrivate::getGraphParts(Qt::Orientation)::__0>
                            *)&local_68,(iterator)(iVar5.i + 3));
        abegin.i = iVar5.i + 3;
        if (bVar1) goto LAB_005ce487;
        iVar5.i = iVar5.i + 4;
        lVar6 = lVar6 + -1;
      } while (1 < lVar6);
    }
    lVar6 = (long)iVar4.i - (long)iVar5.i >> 3;
    if (lVar6 == 1) {
LAB_005ce473:
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<QGraphicsAnchorLayoutPrivate::getGraphParts(Qt::Orientation)::$_0>::
              operator()((_Iter_pred<QGraphicsAnchorLayoutPrivate::getGraphParts(Qt::Orientation)::__0>
                          *)&local_68,iVar5);
      abegin.i = iVar5.i;
      if (!bVar1) {
        abegin.i = iVar4.i;
      }
    }
    else if (lVar6 == 2) {
LAB_005ce460:
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<QGraphicsAnchorLayoutPrivate::getGraphParts(Qt::Orientation)::$_0>::
              operator()((_Iter_pred<QGraphicsAnchorLayoutPrivate::getGraphParts(Qt::Orientation)::__0>
                          *)&local_68,iVar5);
      abegin.i = iVar5.i;
      if (!bVar1) {
        iVar5.i = iVar5.i + 1;
        goto LAB_005ce473;
      }
    }
    else {
      abegin.i = iVar4.i;
      if ((lVar6 == 3) &&
         (bVar1 = __gnu_cxx::__ops::
                  _Iter_pred<QGraphicsAnchorLayoutPrivate::getGraphParts(Qt::Orientation)::$_0>::
                  operator()((_Iter_pred<QGraphicsAnchorLayoutPrivate::getGraphParts(Qt::Orientation)::__0>
                              *)&local_68,iVar5), abegin.i = iVar5.i, !bVar1)) {
        iVar5.i = iVar5.i + 1;
        goto LAB_005ce460;
      }
    }
LAB_005ce487:
    iVar5.i = abegin.i + 1;
    if (iVar5.i != iVar4.i && abegin.i != iVar4.i) {
      do {
        bVar1 = __gnu_cxx::__ops::
                _Iter_pred<QGraphicsAnchorLayoutPrivate::getGraphParts(Qt::Orientation)::$_0>::
                operator()((_Iter_pred<QGraphicsAnchorLayoutPrivate::getGraphParts(Qt::Orientation)::__0>
                            *)&local_48,iVar5);
        if (!bVar1) {
          *abegin.i = *iVar5.i;
          abegin.i = abegin.i + 1;
        }
        iVar5.i = iVar5.i + 1;
      } while (iVar5.i != iVar4.i);
    }
    bVar1 = abegin.i == iVar4.i;
    iVar4.i = abegin.i;
    if (bVar1) {
      iVar4 = QList<QSimplexConstraint_*>::end(this_00);
      QList<QSimplexConstraint_*>::erase(this_00,(const_iterator)abegin.i,(const_iterator)iVar4.i);
      QHash<QSimplexVariable_*,_QHashDummyValue>::~QHash(&local_70);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

QGraphicsAnchorLayoutPrivate::GraphParts
QGraphicsAnchorLayoutPrivate::getGraphParts(Qt::Orientation orientation)
{
    GraphParts result;

    Q_ASSERT(layoutFirstVertex[orientation] && layoutLastVertex[orientation]);

    AnchorData *edgeL1 = nullptr;
    AnchorData *edgeL2 = nullptr;

    // The layout may have a single anchor between Left and Right or two half anchors
    // passing through the center
    if (layoutCentralVertex[orientation]) {
        edgeL1 = graph[orientation].edgeData(layoutFirstVertex[orientation], layoutCentralVertex[orientation]);
        edgeL2 = graph[orientation].edgeData(layoutCentralVertex[orientation], layoutLastVertex[orientation]);
    } else {
        edgeL1 = graph[orientation].edgeData(layoutFirstVertex[orientation], layoutLastVertex[orientation]);
    }

    result.nonTrunkConstraints = constraints[orientation] + itemCenterConstraints[orientation];

    QSet<QSimplexVariable *> trunkVariables;

    trunkVariables += edgeL1;
    if (edgeL2)
        trunkVariables += edgeL2;

    bool dirty;
    auto end = result.nonTrunkConstraints.end();
    do {
        dirty = false;

        auto isMatch = [&result, &trunkVariables](QSimplexConstraint *c) -> bool {
            bool match = false;

            // Check if this constraint have some overlap with current
            // trunk variables...
            for (QSimplexVariable *ad : std::as_const(trunkVariables)) {
                if (c->variables.contains(ad)) {
                    match = true;
                    break;
                }
            }

            // If so, we add it to trunk, and erase it from the
            // remaining constraints.
            if (match) {
                result.trunkConstraints += c;
                for (auto jt = c->variables.cbegin(), end = c->variables.cend(); jt != end; ++jt)
                    trunkVariables.insert(jt.key());
                return true;
            } else {
                // Note that we don't erase the constraint if it's not
                // a match, since in a next iteration of a do-while we
                // can pass on it again and it will be a match.
                //
                // For example: if trunk share a variable with
                // remainingConstraints[1] and it shares with
                // remainingConstraints[0], we need a second iteration
                // of the do-while loop to match both.
                return false;
            }
        };
        const auto newEnd = std::remove_if(result.nonTrunkConstraints.begin(), end, isMatch);
        dirty = newEnd != end;
        end = newEnd;
    } while (dirty);

    result.nonTrunkConstraints.erase(end, result.nonTrunkConstraints.end());

    return result;
}